

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O2

Map_Node_t * Map_NodeAnd(Map_Man_t *pMan,Map_Node_t *p1,Map_Node_t *p2)

{
  uint uVar1;
  Map_Node_t *pMVar2;
  int iVar3;
  Map_Node_t **ppMVar4;
  ulong uVar5;
  Map_Node_t *pMVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  Map_Node_t *pMVar11;
  Map_Node_t *pMVar12;
  ulong uVar13;
  timespec local_40;
  
  if (p1 != p2) {
    if ((Map_Node_t *)((ulong)p2 ^ 1) == p1) {
      p1 = (Map_Node_t *)((ulong)pMan->pConst1 ^ 1);
    }
    else {
      iVar3 = *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10);
      if (iVar3 == -1) {
        pMVar6 = pMan->pConst1;
        if (pMVar6 == p1) {
          return p2;
        }
      }
      else {
        iVar9 = *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0x10);
        if (iVar9 != -1) {
          pMVar6 = p2;
          if (iVar9 < iVar3) {
            pMVar6 = p1;
            p1 = p2;
          }
          iVar3 = pMan->nBins;
          uVar10 = (long)pMVar6 * 0xc00005 + (long)p1;
          uVar13 = uVar10 % (ulong)(long)iVar3 & 0xffffffff;
          ppMVar4 = pMan->pBins + uVar13;
          while (pMVar11 = *ppMVar4, pMVar11 != (Map_Node_t *)0x0) {
            if ((pMVar11->p1 == p1) && (pMVar11->p2 == pMVar6)) {
              return pMVar11;
            }
            ppMVar4 = &pMVar11->pNext;
          }
          if (SBORROW4(pMan->nNodes,iVar3 * 2) == pMan->nNodes + iVar3 * -2 < 0) {
            clock_gettime(3,&local_40);
            uVar1 = pMan->nBins;
            iVar3 = Abc_PrimeCudd(uVar1 * 2);
            uVar8 = (ulong)iVar3;
            ppMVar4 = (Map_Node_t **)calloc(1,uVar8 * 8);
            uVar7 = 0;
            uVar13 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar13 = uVar7;
            }
            iVar9 = 0;
            for (; uVar7 != uVar13; uVar7 = uVar7 + 1) {
              pMVar11 = pMan->pBins[uVar7];
              if (pMVar11 != (Map_Node_t *)0x0) goto LAB_00368ba1;
              pMVar2 = (Map_Node_t *)0x0;
              pMVar12 = pMVar11;
              while (pMVar11 = pMVar2, pMVar12 != (Map_Node_t *)0x0) {
                uVar5 = (ulong)((long)pMVar12->p2 * 0xc00005 + (long)pMVar12->p1) % uVar8 &
                        0xffffffff;
                pMVar12->pNext = ppMVar4[uVar5];
                ppMVar4[uVar5] = pMVar12;
                iVar9 = iVar9 + 1;
                pMVar2 = (Map_Node_t *)0x0;
                pMVar12 = pMVar11;
                if (pMVar11 != (Map_Node_t *)0x0) {
LAB_00368ba1:
                  pMVar2 = pMVar11->pNext;
                  pMVar12 = pMVar11;
                }
              }
            }
            if (iVar9 != pMan->nNodes - pMan->nInputs) {
              __assert_fail("Counter == pMan->nNodes - pMan->nInputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperCreate.c"
                            ,0x211,"void Map_TableResize(Map_Man_t *)");
            }
            free(pMan->pBins);
            pMan->pBins = ppMVar4;
            pMan->nBins = iVar3;
            uVar13 = uVar10 % uVar8 & 0xffffffff;
          }
          pMVar6 = Map_NodeCreate(pMan,p1,pMVar6);
          ppMVar4 = pMan->pBins;
          pMVar6->pNext = ppMVar4[uVar13];
          ppMVar4[uVar13] = pMVar6;
          return pMVar6;
        }
        pMVar6 = pMan->pConst1;
        if (pMVar6 == p2) {
          return p1;
        }
      }
      p1 = (Map_Node_t *)((ulong)pMVar6 ^ 1);
    }
  }
  return p1;
}

Assistant:

Map_Node_t * Map_NodeAnd( Map_Man_t * pMan, Map_Node_t * p1, Map_Node_t * p2 )
{
    Map_Node_t * pEnt;
    unsigned Key;

    if ( p1 == p2 )
        return p1;
    if ( p1 == Map_Not(p2) )
        return Map_Not(pMan->pConst1);
    if ( Map_NodeIsConst(p1) )
    {
        if ( p1 == pMan->pConst1 )
            return p2;
        return Map_Not(pMan->pConst1);
    }
    if ( Map_NodeIsConst(p2) )
    {
        if ( p2 == pMan->pConst1 )
            return p1;
        return Map_Not(pMan->pConst1);
    }

    if ( Map_Regular(p1)->Num > Map_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Map_HashKey2( p1, p2, pMan->nBins );
    for ( pEnt = pMan->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
            return pEnt;
    // resize the table
    if ( pMan->nNodes >= 2 * pMan->nBins )
    {
        Map_TableResize( pMan );
        Key = Map_HashKey2( p1, p2, pMan->nBins );
    }
    // create the new node
    pEnt = Map_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNext = pMan->pBins[Key];
    pMan->pBins[Key] = pEnt;
    return pEnt;
}